

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Globals.cpp
# Opt level: O0

bool __thiscall OpenMD::Globals::addFragmentStamp(Globals *this,FragmentStamp *fragStamp)

{
  bool bVar1;
  OpenMDException *this_00;
  string *msg;
  undefined8 uVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*>_>,_bool>
  pVar3;
  ostringstream oss;
  bool ret;
  iterator i;
  string fragStampName;
  undefined7 in_stack_fffffffffffffd58;
  undefined1 in_stack_fffffffffffffd5f;
  byte bVar4;
  FragmentStamp **in_stack_fffffffffffffd60;
  value_type *in_stack_fffffffffffffd68;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*>
  *in_stack_fffffffffffffd70;
  string local_230 [32];
  ostringstream local_210 [376];
  _Base_ptr local_98;
  undefined1 local_90;
  _Self local_60 [3];
  _Base_ptr local_48;
  undefined1 local_39;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*>_>
  local_38;
  string local_30 [48];
  
  FragmentStamp::getName_abi_cxx11_
            ((FragmentStamp *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*>_>
  ::_Rb_tree_iterator(&local_38);
  local_39 = 0;
  local_48 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*>_>_>
                     *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
                    (key_type *)0x2467c9);
  local_38._M_node = local_48;
  local_60[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*>_>_>
              *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
  bVar1 = std::operator==(&local_38,local_60);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_210);
    this_00 = (OpenMDException *)
              std::operator<<((ostream *)local_210,"Globals Error: Fragment Stamp ");
    FragmentStamp::getName_abi_cxx11_
              ((FragmentStamp *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
    msg = (string *)std::operator<<((ostream *)this_00,local_230);
    std::operator<<((ostream *)msg,"appears multiple times\n");
    std::__cxx11::string::~string(local_230);
    uVar2 = __cxa_allocate_exception(0x28);
    std::__cxx11::ostringstream::str();
    OpenMDException::OpenMDException(this_00,msg);
    __cxa_throw(uVar2,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
  }
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_OpenMD::FragmentStamp_*&,_true>
            (in_stack_fffffffffffffd70,&in_stack_fffffffffffffd68->first,in_stack_fffffffffffffd60);
  pVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*>_>_>
                    *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  local_98 = (_Base_ptr)pVar3.first._M_node;
  local_90 = pVar3.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*>
           *)0x246895);
  local_39 = 1;
  bVar4 = 1;
  std::__cxx11::string::~string(local_30);
  return (bool)(bVar4 & 1);
}

Assistant:

bool Globals::addFragmentStamp(FragmentStamp* fragStamp) {
    std::string fragStampName = fragStamp->getName();
    std::map<std::string, FragmentStamp*>::iterator i;
    bool ret = false;
    i        = fragmentStamps_.find(fragStampName);
    if (i == fragmentStamps_.end()) {
      fragmentStamps_.insert(std::map<std::string, FragmentStamp*>::value_type(
          fragStampName, fragStamp));
      ret = true;
    } else {
      std::ostringstream oss;
      oss << "Globals Error: Fragment Stamp " << fragStamp->getName()
          << "appears multiple times\n";
      throw OpenMDException(oss.str());
    }
    return ret;
  }